

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManTransformRefs(Gia_Man_t *p,int *pnObjs,int *pnFanios)

{
  undefined1 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vVisit;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  if (p->pRefs == (int *)0x0) {
    __assert_fail("p->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x183,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
  }
  Gia_ManCleanMark0(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x40000000;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      iVar9 = pVVar8->pArray[lVar6];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00731301;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar9].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar6 = lVar6 + 1;
      pVVar8 = p->vCis;
    } while (lVar6 < pVVar8->nSize);
  }
  uVar4 = p->nObjs;
  if (0 < (int)uVar4) {
    lVar6 = 0;
    lVar10 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar12 = (uint)*(ulong *)(&pGVar2->field_0x0 + lVar6);
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        *(ulong *)(&pGVar2->field_0x0 + lVar6) =
             *(ulong *)(&pGVar2->field_0x0 + lVar6) & 0xffffffff3fffffff |
             (ulong)((uint)(1 < p->pRefs[lVar10]) << 0x1e);
        uVar4 = p->nObjs;
      }
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar10 < (int)uVar4);
  }
  pVVar8 = p->vCos;
  iVar9 = pVVar8->nSize;
  if (0 < iVar9) {
    lVar6 = 0;
    do {
      iVar9 = pVVar8->pArray[lVar6];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00731301;
      pGVar2 = p->pObjs + iVar9;
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) | 0x40000000;
      lVar6 = lVar6 + 1;
      pVVar8 = p->vCos;
      iVar9 = pVVar8->nSize;
    } while (lVar6 < iVar9);
    uVar4 = p->nObjs;
  }
  if ((int)uVar4 < 1) {
LAB_007310d7:
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_007310d7;
      iVar5 = iVar5 + (uint)((*(uint *)(&p->pObjs->field_0x0 + lVar6) >> 0x1e & 1) != 0);
      lVar6 = lVar6 + 0xc;
    } while ((ulong)uVar4 * 0xc != lVar6);
  }
  *pnObjs = iVar5 + iVar9;
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
  }
  piVar7 = (int *)calloc((long)p->nObjs,4);
  p->pRefs = piVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar8->pArray = piVar7;
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = 100;
  vVisit->nSize = 0;
  piVar7 = (int *)malloc(400);
  vVisit->pArray = piVar7;
  Gia_ManCleanMark1(p);
  iVar9 = p->nObjs;
  if (iVar9 < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    while (p->pObjs != (Gia_Obj_t *)0x0) {
      pGVar2 = p->pObjs + lVar6;
      uVar4 = *(uint *)pGVar2;
      if ((uVar4 & 0xc0000000) == 0x40000000 && (~uVar4 & 0x1fffffff) != 0) {
        Emb_ManCollectSuper(p,pGVar2,pVVar8,vVisit);
        iVar9 = pVVar8->nSize;
        if (0 < (long)iVar9) {
          piVar7 = pVVar8->pArray;
          lVar10 = 0;
          do {
            lVar11 = (long)piVar7[lVar10];
            if ((lVar11 < 0) || (p->nObjs <= piVar7[lVar10])) goto LAB_00731301;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->pObjs[lVar11].field_0x3 & 0x40) == 0) {
              __assert_fail("pFanin->fMark0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                            ,0x1a7,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
            }
            p->pRefs[lVar11] = p->pRefs[lVar11] + 1;
            lVar10 = lVar10 + 1;
          } while (iVar9 != lVar10);
        }
        iVar5 = iVar9 + iVar5;
        iVar9 = p->nObjs;
      }
      lVar6 = lVar6 + 1;
      if (iVar9 <= lVar6) break;
    }
  }
  Gia_ManCheckMark1(p);
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  if (vVisit->pArray != (int *)0x0) {
    free(vVisit->pArray);
  }
  free(vVisit);
  pVVar8 = p->vCos;
  iVar9 = pVVar8->nSize;
  if (0 < iVar9) {
    piVar7 = pVVar8->pArray;
    lVar6 = 0;
    do {
      iVar9 = piVar7[lVar6];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_00731301:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      pGVar2 = pGVar3 + iVar9;
      uVar13 = (ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
      if ((pGVar2[-uVar13].field_0x3 & 0x40) == 0) {
        __assert_fail("pObj->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                      ,0x1b2,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
      }
      pGVar2 = pGVar2 + -uVar13;
      if ((pGVar2 < pGVar3) || (pGVar3 + (uint)p->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      p->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555] =
           p->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555] + 1;
      lVar6 = lVar6 + 1;
      iVar9 = pVVar8->nSize;
    } while (lVar6 < iVar9);
  }
  *pnFanios = iVar9 + iVar5;
  return;
}

Assistant:

void Emb_ManTransformRefs( Gia_Man_t * p, int * pnObjs, int * pnFanios )  
{
    Vec_Int_t * vSuper, * vVisit;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, Counter;
    assert( p->pRefs != NULL );

    // mark nodes to be used in the logic network
    Gia_ManCleanMark0( p );
    Gia_ManConst0(p)->fMark0 = 1;
    // mark the inputs
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 1;
    // mark those nodes that have ref count more than 1
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = (Gia_ObjRefNum(p, pObj) > 1);
    // mark the output drivers
    Gia_ManForEachCoDriver( p, pObj, i )
        pObj->fMark0 = 1;

    // count the number of nodes
    Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += pObj->fMark0;
    *pnObjs = Counter + Gia_ManCoNum(p);

    // reset the references
    ABC_FREE( p->pRefs );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    // reference from internal nodes
    Counter = 0;
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManCleanMark1( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
            continue;
        Emb_ManCollectSuper( p, pObj, vSuper, vVisit );
        Gia_ManForEachObjVec( vSuper, p, pFanin, k )
        {
            assert( pFanin->fMark0 );
            Gia_ObjRefInc( p, pFanin );
        }
        Counter += Vec_IntSize( vSuper );
    }
    Gia_ManCheckMark1( p );
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // reference from outputs
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        assert( pObj->fMark0 );
        Gia_ObjRefInc( p, pObj );
    }
    *pnFanios = Counter + Gia_ManCoNum(p);
}